

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64emithelper.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::a64::EmitHelper::emitArgMove
          (EmitHelper *this,BaseReg *dst_,TypeId dstTypeId,Operand_ *src_,TypeId srcTypeId,
          char *comment)

{
  byte bVar1;
  uint8_t uVar2;
  uint16_t uVar3;
  byte bVar4;
  Error EVar5;
  GroupData *pGVar6;
  Reg *pRVar7;
  LoadStoreInstructions *pLVar8;
  undefined8 uVar9;
  uint uVar10;
  uint32_t uVar11;
  undefined7 in_register_00000011;
  ulong uVar12;
  InstId instId;
  BaseEmitter *pBVar13;
  Reg dst;
  Operand src;
  RegGroup RStack_141;
  Operand_ OStack_140;
  uint32_t uStack_124;
  uint32_t uStack_120;
  uint32_t uStack_11c;
  EVP_PKEY_CTX *pEStack_118;
  Operand_ OStack_110;
  Operand_ OStack_100;
  undefined8 uStack_f0;
  PrologEpilogInfo PStack_e4;
  Operand_ local_28;
  Operand_ local_18;
  
  uVar12 = CONCAT71(in_register_00000011,dstTypeId);
  if ((int)uVar12 == 0) {
    uVar12 = (ulong)*(byte *)((ulong)((dst_->super_Operand).super_Operand_._signature._bits >> 3 &
                                     0x1f) +
                             (ulong)(((this->super_BaseEmitHelper)._emitter)->_environment)._arch *
                             0xd8 + 0x14b094);
  }
  bVar4 = (byte)uVar12;
  if (((byte)(bVar4 + 0x9b) < 0xbb) || ((bVar4 & 0x7e) == 0x20)) {
    emitArgMove();
LAB_00134f66:
    emitArgMove();
    pBVar13 = (this->super_BaseEmitHelper)._emitter;
    EVar5 = PrologEpilogInfo::init(&PStack_e4,(EVP_PKEY_CTX *)dst_);
    if (EVar5 != 0) {
      return EVar5;
    }
    uStack_11c = PStack_e4.sizeTotal;
    uStack_120 = -PStack_e4.sizeTotal;
    uStack_124 = (int)uStack_120 >> 0x1f;
    uVar9 = 0;
    pEStack_118 = (EVP_PKEY_CTX *)dst_;
    while( true ) {
      if ((RegGroup)uVar9 == kMask) break;
      RStack_141 = (RegGroup)uVar9;
      uStack_f0 = uVar9;
      pGVar6 = Support::Array<asmjit::v1_14::a64::PrologEpilogInfo::GroupData,_2UL>::
               operator[]<asmjit::v1_14::RegGroup>(&PStack_e4.groups,&RStack_141);
      uVar10 = pGVar6->pairCount;
      pRVar7 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                         (&emitProlog::groupRegs,&RStack_141);
      OStack_110._signature._bits =
           (pRVar7->super_BaseReg).super_Operand.super_Operand_._signature._bits;
      OStack_110._baseId = (pRVar7->super_BaseReg).super_Operand.super_Operand_._baseId;
      OStack_110._data = *&(pRVar7->super_BaseReg).super_Operand.super_Operand_._data;
      pRVar7 = Support::Array<asmjit::v1_14::arm::Reg,_2UL>::operator[]<asmjit::v1_14::RegGroup>
                         (&emitProlog::groupRegs,&RStack_141);
      OStack_100._signature._bits =
           (pRVar7->super_BaseReg).super_Operand.super_Operand_._signature._bits;
      OStack_100._baseId = (pRVar7->super_BaseReg).super_Operand.super_Operand_._baseId;
      OStack_100._data = *&(pRVar7->super_BaseReg).super_Operand.super_Operand_._data;
      OStack_140._signature._bits = 0x3a;
      OStack_140._baseId = 0x1f;
      OStack_140._data[0] = 0;
      OStack_140._data[1] = 0;
      pLVar8 = Support::Array<asmjit::v1_14::a64::LoadStoreInstructions,_2UL>::
               operator[]<asmjit::v1_14::RegGroup>(&emitProlog::groupInsts,&RStack_141);
      for (uVar12 = 0; uVar10 != uVar12; uVar12 = uVar12 + 1) {
        OStack_110._baseId._0_1_ = pGVar6->pairs[uVar12].ids[0];
        OStack_110._baseId._1_3_ = 0;
        uVar2 = pGVar6->pairs[uVar12].ids[1];
        OStack_100._baseId._0_1_ = uVar2;
        OStack_100._baseId._1_3_ = 0;
        uVar3 = pGVar6->pairs[uVar12].offset;
        OStack_140._data[1]._0_2_ = uVar3;
        OStack_140._data[1]._2_2_ = 0;
        if (uVar3 == 0 && uStack_11c != 0) {
          OStack_140._data[1] = uStack_120;
          uVar11 = uStack_124;
          if ((OStack_140._0_8_ & 0xf8) != 0) {
            uVar11 = OStack_140._baseId;
          }
          OStack_140._0_8_ =
               CONCAT44(uVar11,OStack_140._signature._bits) & 0xfffffffffcffffff | 0x1000000;
        }
        if (uVar2 == 0xff) {
          EVar5 = BaseEmitter::_emitI(pBVar13,pLVar8->singleInstId,&OStack_110,&OStack_140);
        }
        else {
          EVar5 = BaseEmitter::_emitI(pBVar13,pLVar8->pairInstId,&OStack_110,&OStack_100,&OStack_140
                                     );
        }
        if (EVar5 != 0) {
          return EVar5;
        }
        OStack_140._0_8_ = OStack_140._0_8_ & 0xfffffffffcffffff;
        if (((uVar12 == 0) && (((byte)*pEStack_118 & 0x10) != 0)) &&
           (EVar5 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::mov
                              ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)pBVar13,
                               (Gp *)regs::x29,(Gp *)regs::sp), EVar5 != 0)) {
          return EVar5;
        }
      }
      uVar9 = CONCAT71((int7)((ulong)uStack_f0 >> 8),(char)uStack_f0 + '\x01');
    }
    uVar10 = *(uint *)(pEStack_118 + 0x2c);
    if (uVar10 == 0) {
      return 0;
    }
    if (0xfff < uVar10) {
      if (0xffffff < uVar10) {
        return 3;
      }
      OStack_110._signature._bits = 4;
      OStack_110._baseId = 0;
      OStack_110._data[1] = 0;
      OStack_110._data[0] = uVar10 & 0xfff;
      EVar5 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::sub
                        ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)pBVar13,(Gp *)regs::sp,
                         (Gp *)regs::sp,(Imm *)&OStack_110);
      if (EVar5 != 0) {
        return EVar5;
      }
      uVar10 = uVar10 & 0xfff000;
    }
    OStack_110._signature._bits = 4;
    OStack_110._baseId = 0;
    OStack_110._data[1] = 0;
    OStack_110._data[0] = uVar10;
    EVar5 = EmitterExplicitT<asmjit::v1_14::a64::Emitter>::sub
                      ((EmitterExplicitT<asmjit::v1_14::a64::Emitter> *)pBVar13,(Gp *)regs::sp,
                       (Gp *)regs::sp,(Imm *)&OStack_110);
    if (EVar5 != 0) {
      return EVar5;
    }
    return 0;
  }
  if (((byte)(srcTypeId + ~_kVec512End) < 0xbb) || ((srcTypeId & 0x7e) == _kBaseStart))
  goto LAB_00134f66;
  local_28._signature._bits = (dst_->super_Operand).super_Operand_._signature._bits;
  local_28._baseId = (dst_->super_Operand).super_Operand_._baseId;
  local_28._data = *&(dst_->super_Operand).super_Operand_._data;
  local_18._signature._bits = (src_->_signature)._bits;
  local_18._baseId = src_->_baseId;
  local_18._data[0] = src_->_data[0];
  local_18._data[1] = src_->_data[1];
  bVar1 = TypeUtils::_typeData[(ulong)srcTypeId + 0x100];
  if (((byte)(srcTypeId - _kBaseStart) < 10) && ((byte)(bVar4 - 0x20) < 10)) {
    local_28._signature._bits = 0x4000031;
    if (TypeUtils::_typeData[(uVar12 & 0xff) + 0x100] == '\b') {
      local_28._signature._bits = 0x8000039;
    }
    pBVar13 = (this->super_BaseEmitHelper)._emitter;
    pBVar13->_inlineComment = comment;
    if ((local_18._signature._bits & 7) == 2) {
      EVar5 = (*(code *)(&DAT_00150aec + *(int *)(&DAT_00150aec + (ulong)(srcTypeId - 0x22) * 4)))
                        (this,(ulong)(srcTypeId - 0x22),
                         &DAT_00150aec + *(int *)(&DAT_00150aec + (ulong)(srcTypeId - 0x22) * 4));
      return EVar5;
    }
    if ((local_18._signature._bits & 7) != 1) goto LAB_00134e2a;
    instId = 0xf4;
    local_18._signature._bits = local_28._signature._bits;
  }
  else {
LAB_00134e2a:
    EVar5 = 3;
    if (2 < (byte)(bVar4 - 0x2a) && 0x31 < (byte)(bVar4 - 0x33)) {
      return 3;
    }
    if (2 < (byte)(srcTypeId - _kFloatStart) && 0x31 < (byte)(srcTypeId - _kVec32Start)) {
      return 3;
    }
    uVar10 = bVar1 - 2;
    switch(uVar10 >> 1 | (uint)((uVar10 & 1) != 0) << 0x1f) {
    case 0:
      local_28._signature._bits = 0x2000149;
      uVar10 = 0x2000149;
      break;
    case 1:
      local_28._signature._bits = 0x4000151;
      uVar10 = 0x4000151;
      break;
    default:
      goto switchD_00134e85_caseD_2;
    case 3:
      local_28._signature._bits = 0x8000159;
      uVar10 = 0x8000159;
      break;
    case 7:
      local_28._signature._bits = 0x10000161;
      uVar10 = 0x10000161;
    }
    pBVar13 = (this->super_BaseEmitHelper)._emitter;
    pBVar13->_inlineComment = comment;
    if ((local_18._signature._bits & 7) == 2) {
      instId = 0x224;
    }
    else {
      if ((local_18._signature._bits & 7) != 1) {
        return 3;
      }
      instId = 0x228;
      local_18._signature._bits = uVar10;
      if (bVar1 < 5) {
        instId = 0x1ff;
      }
    }
  }
  EVar5 = BaseEmitter::_emitI(pBVar13,instId,&local_28,&local_18);
switchD_00134e85_caseD_2:
  return EVar5;
}

Assistant:

Error EmitHelper::emitArgMove(
  const BaseReg& dst_, TypeId dstTypeId,
  const Operand_& src_, TypeId srcTypeId, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (dstTypeId == TypeId::kVoid) {
    const ArchTraits& archTraits = ArchTraits::byArch(_emitter->arch());
    dstTypeId = archTraits.regTypeToTypeId(dst_.type());
  }

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeUtils::isValid(dstTypeId) && !TypeUtils::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeUtils::isValid(srcTypeId) && !TypeUtils::isAbstract(srcTypeId));

  Reg dst(dst_.as<Reg>());
  Operand src(src_);

  uint32_t dstSize = TypeUtils::sizeOf(dstTypeId);
  uint32_t srcSize = TypeUtils::sizeOf(srcTypeId);

  if (TypeUtils::isInt(dstTypeId)) {
    if (TypeUtils::isInt(srcTypeId)) {
      uint32_t x = uint32_t(dstSize == 8);

      dst.setSignature(OperandSignature{x ? uint32_t(GpX::kSignature) : uint32_t(GpW::kSignature)});
      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        src.setSignature(dst.signature());
        return _emitter->emit(Inst::kIdMov, dst, src);
      }
      else if (src.isMem()) {
        InstId instId = Inst::kIdNone;
          switch (srcTypeId) {
          case TypeId::kInt8: instId = Inst::kIdLdrsb; break;
          case TypeId::kUInt8: instId = Inst::kIdLdrb; break;
          case TypeId::kInt16: instId = Inst::kIdLdrsh; break;
          case TypeId::kUInt16: instId = Inst::kIdLdrh; break;
          case TypeId::kInt32: instId = x ? Inst::kIdLdrsw : Inst::kIdLdr; break;
          case TypeId::kUInt32: instId = Inst::kIdLdr; break;
          case TypeId::kInt64: instId = Inst::kIdLdr; break;
          case TypeId::kUInt64: instId = Inst::kIdLdr; break;
          default:
            return DebugUtils::errored(kErrorInvalidState);
        }
        return _emitter->emit(instId, dst, src);
      }
    }
  }

  if (TypeUtils::isFloat(dstTypeId) || TypeUtils::isVec(dstTypeId)) {
    if (TypeUtils::isFloat(srcTypeId) || TypeUtils::isVec(srcTypeId)) {
      switch (srcSize) {
        case 2: dst.as<Vec>().setSignature(OperandSignature{VecH::kSignature}); break;
        case 4: dst.as<Vec>().setSignature(OperandSignature{VecS::kSignature}); break;
        case 8: dst.as<Vec>().setSignature(OperandSignature{VecD::kSignature}); break;
        case 16: dst.as<Vec>().setSignature(OperandSignature{VecV::kSignature}); break;
        default:
          return DebugUtils::errored(kErrorInvalidState);
      }

      _emitter->setInlineComment(comment);

      if (src.isReg()) {
        InstId instId = srcSize <= 4 ? Inst::kIdFmov_v : Inst::kIdMov_v;
        src.setSignature(dst.signature());
        return _emitter->emit(instId, dst, src);
      }
      else if (src.isMem()) {
        return _emitter->emit(Inst::kIdLdr_v, dst, src);
      }
    }
  }

  return DebugUtils::errored(kErrorInvalidState);
}